

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
ImageBox::writeXml_abi_cxx11_(string *__return_storage_ptr__,ImageBox *this,int indent)

{
  int indent_00;
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  ImageScaleType scaleType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  stringstream str;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<ImageBox",9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"imageScaleType","");
  Util::toString_abi_cxx11_(&local_1f8,(Util *)(ulong)this->imageScaleType,scaleType);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1d8,(Util *)local_1b8,(stringstream *)local_218,&local_1f8,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  indent_00 = indent + 1;
  NinePatchMargin::writeXml_abi_cxx11_(&local_278,&this->ninePatchMargin,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_278._M_dataplus._M_p,local_278._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Image","");
  pcVar1 = (this->image)._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar1,pcVar1 + (this->image)._M_string_length);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_238,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  Widget::writeXmlElements(&this->super_Widget,(stringstream *)local_1b8,indent_00);
  if ((this->super_Widget).numChildren < 1) {
    Util::getIndent_abi_cxx11_(0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</ImageBox>",0xb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
  }
  else {
    Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b8,indent);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageBox::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ImageBox";
	writeXmlAttributes(str);
	Util::writeXmlAttribute(str, "imageScaleType", Util::toString(imageScaleType));
	str << ">" << std::endl;
	str << ninePatchMargin.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "Image", image);

	Widget::writeXmlElements(str, indent + 1);

	if (numChildren <= 0)
	{
		str << Util::getIndent(indent) << "</ImageBox>";
		return str.str();
	}

	writeXmlChildren(str, indent);

	return str.str();
}